

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  float local_18;
  char local_11;
  float accumulator;
  undefined4 uStack_c;
  char operator;
  float number;
  
  uStack_c = 0;
  local_18 = 0.0;
  printf("Begin Calculations\n");
  do {
    __isoc99_scanf("%f %c",&accumulator,&local_11);
    switch(local_11) {
    case '*':
      local_18 = accumulator * local_18;
      break;
    case '+':
      local_18 = accumulator + local_18;
      break;
    default:
      printf("Unknown operator.\n");
      break;
    case '-':
      local_18 = local_18 - accumulator;
      break;
    case '/':
      local_18 = local_18 / accumulator;
      break;
    case 'E':
      printf("End of program\n");
      break;
    case 'S':
      local_18 = accumulator;
    }
    printf("= %f\n",(double)local_18);
  } while (local_11 != 'E');
  printf("End of Calculations\n");
  return 0;
}

Assistant:

int main() {

    float number;
    char operator;
    float accumulator = 0.0f;

    printf("Begin Calculations\n");
    do {

        scanf("%f %c", &number, &operator);

        switch (operator) {
            case 'S':
                accumulator = number;
                break;
            case '+':
                accumulator += number;
                break;
            case '-':
                accumulator -= number;
                break;
            case '*':
                accumulator *= number;
                break;
            case '/':
                accumulator /= number;
                break;
            case 'E':
                printf("End of program\n");
                break;
            default:
                printf("Unknown operator.\n");
                break;
        }

        printf("= %f\n", accumulator);

    } while (operator != 'E');
    printf("End of Calculations\n");

    return 0;
}